

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

TArray<FSoundID,_FSoundID> * __thiscall
TArray<FSoundID,_FSoundID>::operator=
          (TArray<FSoundID,_FSoundID> *this,TArray<FSoundID,_FSoundID> *other)

{
  if (other != this) {
    if (this->Array != (FSoundID *)0x0) {
      M_Free(this->Array);
    }
    DoCopy(this,other);
  }
  return this;
}

Assistant:

TArray<T,TT> &operator= (const TArray<T,TT> &other)
	{
		if (&other != this)
		{
			if (Array != NULL)
			{
				if (Count > 0)
				{
					DoDelete (0, Count-1);
				}
				M_Free (Array);
			}
			DoCopy (other);
		}
		return *this;
	}